

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[7],char_const*,char[15],char[98],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[184]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [7],char **RestArgs,char (*RestArgs_1) [15],char (*RestArgs_2) [98],
               char **RestArgs_3,char (*RestArgs_4) [20],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_5,
               char (*RestArgs_6) [6],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_7,
               char (*RestArgs_8) [184])

{
  std::operator<<((ostream *)(ss + 0x10),*FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[15],char[98],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[184]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7,RestArgs_8);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}